

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

int ixmlNode_hasAttributes(IXML_Node_conflict *nodeptr)

{
  if (((nodeptr != (IXML_Node_conflict *)0x0) && (nodeptr->nodeType == eELEMENT_NODE)) &&
     (nodeptr->firstAttr != (Nodeptr)0x0)) {
    return 1;
  }
  return 0;
}

Assistant:

int ixmlNode_hasAttributes(IXML_Node *nodeptr)
{
	if (nodeptr != NULL) {
		switch (nodeptr->nodeType) {
		case eELEMENT_NODE:
			if (nodeptr->firstAttr != NULL)
				return 1;
			break;
		default:
			break;
		}
	}

	return 0;
}